

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

int Abc_NtkMfsEdgePower(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pObj;
  float fVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  local_2c = 0;
  do {
    iVar1 = Abc_ObjFaninNum(pNode);
    if (iVar1 <= local_2c) {
      return 0;
    }
    pObj = Abc_ObjFanin(pNode,local_2c);
    fVar2 = Abc_MfsObjProb(p,pObj);
    if (fVar2 < 0.35) {
      fVar2 = Abc_MfsObjProb(p,pObj);
      if ((0.25 <= fVar2) && (iVar1 = Abc_NtkMfsSolveSatResub(p,pNode,local_2c,1,0), iVar1 != 0)) {
        return 1;
      }
    }
    else {
      iVar1 = Abc_NtkMfsSolveSatResub(p,pNode,local_2c,0,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Abc_NtkMfsEdgePower( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    int i;
    // try replacing area critical fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
	{
        if ( Abc_MfsObjProb(p, pFanin) >= 0.35 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        } else if ( Abc_MfsObjProb(p, pFanin) >= 0.25 ) // sjang
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 1, 0 ) )
                return 1;
        }
        }
    return 0;
}